

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_highpc_b(Dwarf_Die die,Dwarf_Addr *return_value,Dwarf_Half *return_form,
                  Dwarf_Form_Class *return_class,Dwarf_Error *error)

{
  Dwarf_Bool DVar1;
  int iVar2;
  Dwarf_Unsigned DStack_e0;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Signed sval;
  Dwarf_Byte_Ptr info_ptr2;
  Dwarf_Unsigned v;
  Dwarf_Byte_Ptr pDStack_b0;
  int res3;
  Dwarf_Byte_Ptr readend;
  Dwarf_Addr _ltmp;
  Dwarf_CU_Context_conflict context;
  Dwarf_Unsigned DStack_90;
  int res2;
  Dwarf_Unsigned index_to_addr;
  Dwarf_Unsigned addr_out;
  Dwarf_Addr addr;
  Dwarf_Debug ckdi_dbg;
  Dwarf_Byte_Ptr pDStack_68;
  int res;
  Dwarf_Byte_Ptr die_info_end;
  Dwarf_Form_Class local_58;
  ushort local_54;
  Dwarf_Half version;
  Dwarf_Form_Class class;
  Dwarf_Half offset_size;
  Dwarf_Half address_size;
  Dwarf_Debug dbg;
  Dwarf_Small *pDStack_40;
  Dwarf_Half attr_form;
  Dwarf_Byte_Ptr info_ptr;
  Dwarf_Error *error_local;
  Dwarf_Form_Class *return_class_local;
  Dwarf_Half *return_form_local;
  Dwarf_Addr *return_value_local;
  Dwarf_Die die_local;
  
  pDStack_40 = (Dwarf_Small *)0x0;
  dbg._6_2_ = DW_FORM_CLASS_UNKNOWN;
  _class = (Dwarf_Debug)0x0;
  version = 0;
  local_54 = 0;
  local_58 = 0;
  die_info_end._6_2_ = 0;
  pDStack_68 = (Dwarf_Byte_Ptr)0x0;
  ckdi_dbg._4_4_ = 0;
  addr = 0;
  info_ptr = (Dwarf_Byte_Ptr)error;
  error_local = (Dwarf_Error *)return_class;
  return_class_local = (Dwarf_Form_Class *)return_form;
  return_form_local = (Dwarf_Half *)return_value;
  return_value_local = (Dwarf_Addr *)die;
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    addr = (Dwarf_Addr)die->di_cu_context->cc_dbg;
    if (((Dwarf_Debug)addr == (Dwarf_Debug)0x0) || (((Dwarf_Debug)addr)->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      _class = die->di_cu_context->cc_dbg;
      version = (Dwarf_Half)die->di_cu_context->cc_address_size;
      ckdi_dbg._4_4_ =
           _dwarf_get_value_ptr
                     (die,0x12,(Dwarf_Half *)((long)&dbg + 6),&stack0xffffffffffffffc0,
                      (Dwarf_Signed *)0x0,error);
      die_local._4_4_ = ckdi_dbg._4_4_;
      if ((ckdi_dbg._4_4_ != 1) && (ckdi_dbg._4_4_ != -1)) {
        pDStack_68 = _dwarf_calculate_info_section_end_ptr
                               ((Dwarf_CU_Context_conflict)return_value_local[2]);
        die_info_end._6_2_ = *(Dwarf_Half *)(return_value_local[2] + 0x12);
        local_54 = (ushort)*(byte *)(return_value_local[2] + 0x10);
        local_58 = dwarf_get_form_class(die_info_end._6_2_,0x12,local_54,dbg._6_2_);
        if (local_58 == DW_FORM_CLASS_ADDRESS) {
          addr_out = 0;
          DVar1 = dwarf_addr_form_is_indexed((uint)(ushort)dbg._6_2_);
          if (DVar1 != 0) {
            index_to_addr = 0;
            DStack_90 = 0;
            context._4_4_ = 0;
            _ltmp = return_value_local[2];
            context._4_4_ =
                 _dwarf_get_addr_index_itself
                           ((uint)(ushort)dbg._6_2_,pDStack_40,_class,
                            (Dwarf_CU_Context_conflict)_ltmp,&stack0xffffffffffffff70,
                            (Dwarf_Error *)info_ptr);
            if (context._4_4_ != 0) {
              return context._4_4_;
            }
            iVar2 = _dwarf_look_in_local_and_tied_by_index
                              (_class,(Dwarf_CU_Context_conflict)_ltmp,DStack_90,&index_to_addr,
                               (Dwarf_Error *)info_ptr);
            if (iVar2 != 0) {
              return iVar2;
            }
            context._4_4_ = 0;
          }
          readend = (Dwarf_Byte_Ptr)0x0;
          pDStack_b0 = pDStack_40 + (int)(uint)version;
          if (pDStack_b0 < pDStack_40) {
            _dwarf_error_string(_class,(Dwarf_Error *)info_ptr,0x14b,
                                "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                               );
            return 1;
          }
          if (pDStack_68 < pDStack_b0) {
            _dwarf_error_string(_class,(Dwarf_Error *)info_ptr,0x14b,
                                "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                               );
            return 1;
          }
          (*_class->de_copy_word)(&readend,pDStack_40,(unsigned_long)version);
          *(Dwarf_Byte_Ptr *)return_form_local = readend;
        }
        else {
          v._4_4_ = 0;
          info_ptr2 = (Dwarf_Byte_Ptr)0x0;
          v._4_4_ = _dwarf_die_attr_unsigned_constant
                              ((Dwarf_Die)return_value_local,0x12,(Dwarf_Unsigned *)&info_ptr2,
                               (Dwarf_Error *)info_ptr);
          if (v._4_4_ == 0) {
            *(Dwarf_Byte_Ptr *)return_form_local = info_ptr2;
          }
          else {
            sval = 0;
            v._4_4_ = _dwarf_get_value_ptr
                                ((Dwarf_Die)return_value_local,0x12,(Dwarf_Half *)((long)&dbg + 6),
                                 (Dwarf_Byte_Ptr *)&sval,(Dwarf_Signed *)0x0,(Dwarf_Error *)info_ptr
                                );
            if (v._4_4_ == 1) {
              return 1;
            }
            if (v._4_4_ == -1) {
              return -1;
            }
            if (dbg._6_2_ != DW_FORM_CLASS_MACROPTR) {
              _dwarf_error(_class,(Dwarf_Error *)info_ptr,0x18d);
              return 1;
            }
            lu_leblen = 0;
            lu_local = 0;
            DStack_e0 = 0;
            iVar2 = dwarf_decode_leb128((char *)sval,&lu_local,&stack0xffffffffffffff20,
                                        (char *)pDStack_68);
            if (iVar2 == 1) {
              _dwarf_error_string(_class,(Dwarf_Error *)info_ptr,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
              return 1;
            }
            *(Dwarf_Unsigned *)return_form_local = DStack_e0;
          }
        }
        if (return_class_local != (Dwarf_Form_Class *)0x0) {
          *(undefined2 *)return_class_local = dbg._6_2_;
        }
        if (error_local != (Dwarf_Error *)0x0) {
          *(Dwarf_Form_Class *)error_local = local_58;
        }
        die_local._4_4_ = 0;
      }
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_highpc_b(Dwarf_Die die,
    Dwarf_Addr *return_value,
    Dwarf_Half *return_form,
    enum Dwarf_Form_Class *return_class,
    Dwarf_Error *error)
{
    Dwarf_Byte_Ptr info_ptr = 0;
    Dwarf_Half attr_form = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Half address_size = 0;
    Dwarf_Half offset_size = 0;
    enum Dwarf_Form_Class class = DW_FORM_CLASS_UNKNOWN;
    Dwarf_Half version = 0;
    Dwarf_Byte_Ptr die_info_end = 0;
    int res = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    address_size = die->di_cu_context->cc_address_size;

    res = _dwarf_get_value_ptr(die, DW_AT_high_pc,
        &attr_form,&info_ptr,0,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    die_info_end = _dwarf_calculate_info_section_end_ptr(
        die->di_cu_context);

    version = die->di_cu_context->cc_version_stamp;
    offset_size = die->di_cu_context->cc_length_size;
    class = dwarf_get_form_class(version,DW_AT_high_pc,
        offset_size,attr_form);

    if (class == DW_FORM_CLASS_ADDRESS) {
        Dwarf_Addr addr = 0;
        if (dwarf_addr_form_is_indexed(attr_form)) {
            Dwarf_Unsigned addr_out = 0;
            Dwarf_Unsigned index_to_addr = 0;
            int res2 = 0;
            Dwarf_CU_Context context = die->di_cu_context;

            /*  index_to_addr we get here might apply
                to this dbg or to tieddbg. */
            /* error is returned on dbg, not tied */
            res2 = _dwarf_get_addr_index_itself(attr_form,
                info_ptr,dbg,context,&index_to_addr,error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
            res2= _dwarf_look_in_local_and_tied_by_index(dbg,
                context,
                index_to_addr,
                &addr_out,
                error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
        }
        READ_UNALIGNED_CK(dbg, addr, Dwarf_Addr,
            info_ptr, address_size,
            error,die_info_end);
        *return_value = addr;
    } else {
        int res3 = 0;
        Dwarf_Unsigned v = 0;
        res3 = _dwarf_die_attr_unsigned_constant(die,DW_AT_high_pc,
            &v,error);
        if (res3 != DW_DLV_OK) {
            Dwarf_Byte_Ptr info_ptr2 = 0;

            res3 = _dwarf_get_value_ptr(die, DW_AT_high_pc,
                &attr_form,&info_ptr2,0,error);
            if (res3 == DW_DLV_ERROR) {
                return res3;
            }
            if (res3 == DW_DLV_NO_ENTRY) {
                return res3;
            }
            if (attr_form == DW_FORM_sdata) {
                Dwarf_Signed sval = 0;

                /*  DWARF4 defines the value as an unsigned offset
                    in section 2.17.2. */
                DECODE_LEB128_UWORD_CK(info_ptr2, sval,
                    dbg,error,die_info_end);
                *return_value = (Dwarf_Unsigned)sval;
            } else {
                _dwarf_error(dbg, error, DW_DLE_HIGHPC_WRONG_FORM);
                return DW_DLV_ERROR;
            }
        } else {
            *return_value = v;
        }
    }
    /*  Allow null args starting 22 April 2019. */
    if (return_form) {
        *return_form = attr_form;
    }
    if (return_class) {
        *return_class = class;
    }
    return DW_DLV_OK;
}